

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_argsof.cpp
# Opt level: O0

void __thiscall tst_internals_argsof::callOperator(tst_internals_argsof *this)

{
  tst_internals_argsof *this_local;
  
  return;
}

Assistant:

void tst_internals_argsof::callOperator()
{
    // non-const
    TEST_ARGS_FOR_TYPE(OpNoArg, void);
    TEST_ARGS_FOR_TYPE(OpOneArg, float);
    TEST_ARGS_FOR_TYPE(OpManyArgs, const float&);

    // const
    TEST_ARGS_FOR_TYPE(OpCNoArg, void);
    TEST_ARGS_FOR_TYPE(OpCOneArg, float);
    TEST_ARGS_FOR_TYPE(OpCManyArgs, const float&);

    // volatile
    TEST_ARGS_FOR_TYPE(OpVNoArg, void);
    TEST_ARGS_FOR_TYPE(OpVOneArg, float);
    TEST_ARGS_FOR_TYPE(OpVManyArgs, const float&);

    // const volatile
    TEST_ARGS_FOR_TYPE(OpCVNoArg, void);
    TEST_ARGS_FOR_TYPE(OpCVOneArg, float);
    TEST_ARGS_FOR_TYPE(OpCVManyArgs, const float&);
}